

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O1

void __thiscall
OpenMPDirective::generateDOT
          (OpenMPDirective *this,ofstream *dot_file,int depth,int index,string *parent_node,
          string *trait_score)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OpenMPDirectiveKind OVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar5;
  OpenMPClause *pOVar6;
  _Alloc_hider _Var7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_t sVar13;
  ostream *poVar14;
  char *pcVar15;
  size_type *psVar16;
  ulong *puVar17;
  long *plVar18;
  ulong uVar19;
  SourceLocation *pSVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  undefined8 uVar22;
  uint uVar23;
  OpenMPDirective *pOVar24;
  uint uVar25;
  pointer ppOVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string __str;
  string __str_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_11;
  string expr_name;
  string list_name;
  string tkind;
  string current_line;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_10;
  string directive_id;
  string directive_kind;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  ofstream *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  char *local_168;
  undefined8 local_160;
  char local_158;
  undefined7 uStack_157;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  OpenMPDirective *local_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  uint local_e0;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  string *local_78;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  OVar2 = this->kind;
  local_290 = dot_file;
  local_108 = this;
  local_e0 = depth;
  local_78 = trait_score;
  switch(OVar2) {
  case OMPD_for_simd:
    pcVar15 = "for_simd";
    goto LAB_00159048;
  default:
    toString_abi_cxx11_(&local_128,this);
    toString_abi_cxx11_(&local_d8,this);
    std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_128);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_168);
    if (local_168 != &local_158) {
      operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0015908a;
  case OMPD_distribute_simd:
    pcVar15 = "distribute_simd";
    goto LAB_00159048;
  case OMPD_distribute_parallel_for:
    pcVar15 = "distribute_parallel_for";
    goto LAB_00159048;
  case OMPD_distribute_parallel_do:
    pcVar15 = "distribute_parallel_do";
    goto LAB_00159048;
  case OMPD_distribute_parallel_for_simd:
    pcVar15 = "distribute_parallel_for_simd";
    goto LAB_00159048;
  case OMPD_distribute_parallel_do_simd:
    pcVar15 = "distribute_parallel_do_simd";
    goto LAB_00159048;
  case OMPD_cancellation_point:
    pcVar15 = "cancellation_point";
    goto LAB_00159048;
  case OMPD_declare_reduction:
    pcVar15 = "declare_reduction";
    goto LAB_00159048;
  case OMPD_declare_mapper:
    pcVar15 = "declare_mapper";
    goto LAB_00159048;
  case OMPD_taskloop_simd:
    pcVar15 = "taskloop_simd";
    goto LAB_00159048;
  case OMPD_target_data:
    pcVar15 = "target_data";
    goto LAB_00159048;
  case OMPD_target_enter_data:
    pcVar15 = "target_enter_data";
    goto LAB_00159048;
  case OMPD_target_update:
    pcVar15 = "target_update";
    goto LAB_00159048;
  case OMPD_target_exit_data:
    pcVar15 = "target_exit_data";
    goto LAB_00159048;
  case OMPD_declare_target:
    pcVar15 = "declare_target";
    goto LAB_00159048;
  case OMPD_end_declare_target:
    pcVar15 = "end_declare_target";
    goto LAB_00159048;
  case OMPD_depobj:
    pcVar15 = "depobj ";
LAB_00159048:
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,(ulong)pcVar15);
    goto LAB_0015908a;
  case OMPD_teams_distribute:
    break;
  case OMPD_teams_distribute_simd:
    break;
  case OMPD_teams_distribute_parallel_for:
    break;
  case OMPD_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_loop:
    break;
  case OMPD_target_parallel:
    break;
  case OMPD_target_parallel_for:
    break;
  case OMPD_target_parallel_for_simd:
    break;
  case OMPD_target_parallel_loop:
    break;
  case OMPD_target_simd:
    break;
  case OMPD_target_teams:
    break;
  case OMPD_target_teams_distribute:
    break;
  case OMPD_target_teams_distribute_simd:
    break;
  case OMPD_target_teams_loop:
    break;
  case OMPD_target_teams_distribute_parallel_for:
    break;
  case OMPD_target_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_distribute_parallel_do:
    break;
  case OMPD_teams_distribute_parallel_do_simd:
    break;
  case OMPD_target_parallel_do:
    break;
  case OMPD_target_parallel_do_simd:
    break;
  case OMPD_target_teams_distribute_parallel_do:
    break;
  case OMPD_target_teams_distribute_parallel_do_simd:
  }
  std::__cxx11::string::append((char *)&local_b8);
LAB_0015908a:
  local_168 = &local_158;
  local_160 = 0;
  local_158 = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_128,(char)local_e0);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  pcVar3 = (parent_node->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar3,pcVar3 + parent_node->_M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1a8,(ulong)local_b8._M_dataplus._M_p);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  psVar16 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_1e8.field_2._M_allocated_capacity = *psVar16;
    local_1e8.field_2._8_8_ = plVar11[3];
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar16;
    local_1e8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_1e8._M_string_length = plVar11[1];
  *plVar11 = (long)psVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8 = &local_1b8;
  puVar17 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar17) {
    local_1b8 = *puVar17;
    lStack_1b0 = plVar11[3];
  }
  else {
    local_1b8 = *puVar17;
    local_1c8 = (ulong *)*plVar11;
  }
  local_1c0 = plVar11[1];
  *plVar11 = (long)puVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  uVar23 = -index;
  if (0 < index) {
    uVar23 = index;
  }
  uVar25 = 1;
  if (9 < uVar23) {
    uVar19 = (ulong)uVar23;
    uVar8 = 4;
    do {
      uVar25 = uVar8;
      uVar10 = (uint)uVar19;
      if (uVar10 < 100) {
        uVar25 = uVar25 - 2;
        goto LAB_0015922c;
      }
      if (uVar10 < 1000) {
        uVar25 = uVar25 - 1;
        goto LAB_0015922c;
      }
      if (uVar10 < 10000) goto LAB_0015922c;
      uVar19 = uVar19 / 10000;
      uVar8 = uVar25 + 4;
    } while (99999 < uVar10);
    uVar25 = uVar25 + 1;
  }
LAB_0015922c:
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_288,(char)uVar25 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_288._M_dataplus._M_p + ((uint)index >> 0x1f),uVar25,uVar23);
  uVar19 = 0xf;
  if (local_1c8 != &local_1b8) {
    uVar19 = local_1b8;
  }
  paVar1 = &local_1a8.field_2;
  paVar27 = &local_1e8.field_2;
  paVar21 = &local_288.field_2;
  if (uVar19 < local_288._M_string_length + local_1c0) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar21) {
      uVar22 = local_288.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_288._M_string_length + local_1c0) goto LAB_001592c1;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_1c8);
  }
  else {
LAB_001592c1:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_288._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar16 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_d8.field_2._M_allocated_capacity = *psVar16;
    local_d8.field_2._8_8_ = puVar12[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar16;
    local_d8._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_d8._M_string_length = puVar12[1];
  *puVar12 = psVar16;
  puVar12[1] = 0;
  *(undefined1 *)psVar16 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar21) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar27) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_288,&local_128,parent_node);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
  puVar17 = (ulong *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_1a8.field_2._M_allocated_capacity = *puVar17;
    local_1a8.field_2._8_8_ = plVar11[3];
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *puVar17;
    local_1a8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_1a8._M_string_length = plVar11[1];
  *plVar11 = (long)puVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1a8,(ulong)local_d8._M_dataplus._M_p);
  psVar16 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_1e8.field_2._M_allocated_capacity = *psVar16;
    local_1e8.field_2._8_8_ = plVar11[3];
    local_1e8._M_dataplus._M_p = (pointer)paVar27;
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar16;
    local_1e8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_1e8._M_string_length = plVar11[1];
  *plVar11 = (long)psVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar17 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar17) {
    local_1b8 = *puVar17;
    lStack_1b0 = plVar11[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar17;
    local_1c8 = (ulong *)*plVar11;
  }
  local_1c0 = plVar11[1];
  *plVar11 = (long)puVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar27) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar21) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  pcVar15 = local_168;
  if (local_168 == (char *)0x0) {
    std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
  }
  else {
    sVar13 = strlen(local_168);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
  }
  std::__cxx11::string::append((char *)&local_128);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,local_128._M_dataplus._M_p,local_128._M_string_length);
  _Var7._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
  }
  else {
    sVar13 = strlen(local_d8._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,_Var7._M_p,sVar13);
  }
  paVar27 = &local_1e8.field_2;
  std::operator+(&local_1e8," [label = \"",&local_b8);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar17 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar17) {
    local_1b8 = *puVar17;
    lStack_1b0 = plVar11[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar17;
    local_1c8 = (ulong *)*plVar11;
  }
  local_1c0 = plVar11[1];
  *plVar11 = (long)puVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_1c8,local_1c0);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar27) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  iVar9 = std::__cxx11::string::compare((char *)local_78);
  if (iVar9 != 0) {
    std::operator+(&local_2b0,&local_128,&local_d8);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_288.field_2._M_allocated_capacity = *psVar16;
      local_288.field_2._8_8_ = plVar11[3];
      local_288._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar16;
      local_288._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_288._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_288,(ulong)local_d8._M_dataplus._M_p);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_1a8.field_2._M_allocated_capacity = *psVar16;
      local_1a8.field_2._8_8_ = plVar11[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar16;
      local_1a8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1a8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_1e8.field_2._M_allocated_capacity = *psVar16;
      local_1e8.field_2._8_8_ = plVar11[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar27;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar16;
      local_1e8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1e8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_1b8 = *puVar17;
      lStack_1b0 = plVar11[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar17;
      local_1c8 = (ulong *)*plVar11;
    }
    local_1c0 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar27) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar21) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    paVar27 = &local_2b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar27) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    pcVar15 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
    }
    else {
      sVar13 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
    }
    local_2d0 = &local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d0,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)&local_2d0);
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_d8._M_dataplus._M_p);
    puVar17 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_2b0.field_2._M_allocated_capacity = *puVar17;
      local_2b0.field_2._8_8_ = puVar12[3];
      local_2b0._M_dataplus._M_p = (pointer)paVar27;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *puVar17;
      local_2b0._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_2b0._M_string_length = puVar12[1];
    *puVar12 = puVar17;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    puVar17 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_288.field_2._M_allocated_capacity = *puVar17;
      local_288.field_2._8_8_ = plVar11[3];
      local_288._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_288.field_2._M_allocated_capacity = *puVar17;
      local_288._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_288._M_string_length = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    puVar17 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_1a8.field_2._M_allocated_capacity = *puVar17;
      local_1a8.field_2._8_8_ = plVar11[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar17;
      local_1a8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1a8._M_string_length = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)(local_78->_M_dataplus)._M_p);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_1e8.field_2._M_allocated_capacity = *psVar16;
      local_1e8.field_2._8_8_ = plVar11[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar16;
      local_1e8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1e8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_1b8 = *puVar17;
      lStack_1b0 = plVar11[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar17;
      local_1c8 = (ulong *)*plVar11;
    }
    local_1c0 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar27) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,local_2c0 + 1);
    }
    pcVar15 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
    }
    else {
      sVar13 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
    }
  }
  pOVar24 = local_108;
  paVar21 = &local_288.field_2;
  paVar27 = &local_1e8.field_2;
  if (OVar2 == OMPD_declare_reduction) {
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_108[1].clauses_in_original_order,
               (long)&((local_108[1].clauses_in_original_order)->
                      super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + *(long *)&local_108[1].clauses._M_t._M_impl
              );
    p_Var4 = pOVar24[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_dataplus._M_p = (pointer)paVar27;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,p_Var4,
               (long)&(pOVar24[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->
                      _M_color + (long)p_Var4);
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_allocated_capacity =
         local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_288._M_string_length = 0;
    local_288.field_2._M_allocated_capacity =
         local_288.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    local_288._M_dataplus._M_p = (pointer)paVar21;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"declare_reduction","");
    local_2d0 = &local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d0,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::__cxx11::string::append((char *)&local_2d0);
    std::operator+(&local_208,&local_128,&local_2b0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_248 = &local_238;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_238 = *puVar17;
      lStack_230 = plVar11[3];
    }
    else {
      local_238 = *puVar17;
      local_248 = (ulong *)*plVar11;
    }
    local_240 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_2d0);
    paVar21 = &local_228.field_2;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_228.field_2._M_allocated_capacity = *psVar16;
      local_228.field_2._8_8_ = plVar11[3];
      local_228._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar16;
      local_228._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_228._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268.field_2._8_8_ = plVar11[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_268._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar21) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    pcVar15 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
    }
    else {
      sVar13 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
    }
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)&local_100);
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_2d0);
    local_188 = &local_178;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_178 = *puVar17;
      lStack_170 = plVar11[3];
    }
    else {
      local_178 = *puVar17;
      local_188 = (ulong *)*plVar11;
    }
    local_180 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148.field_2._8_8_ = plVar11[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_148._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_2d0);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_208.field_2._M_allocated_capacity = *psVar16;
      local_208.field_2._8_8_ = plVar11[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar16;
      local_208._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_208._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_248 = &local_238;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_238 = *puVar17;
      lStack_230 = plVar11[3];
    }
    else {
      local_238 = *puVar17;
      local_248 = (ulong *)*plVar11;
    }
    local_240 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1c8);
    puVar17 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_228.field_2._M_allocated_capacity = *puVar17;
      local_228.field_2._8_8_ = plVar11[3];
      local_228._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar17;
      local_228._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_228._M_string_length = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268.field_2._8_8_ = plVar11[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_268._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar21) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    pcVar15 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
    }
    else {
      sVar13 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
    }
    local_228._M_dataplus._M_p = (pointer)paVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::__cxx11::string::append((char *)&local_228);
    local_248 = &local_238;
    std::__cxx11::string::_M_construct((ulong)&local_248,'\x01');
    *(undefined1 *)local_248 = 0x30;
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar21) {
      uVar22 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_240 + local_228._M_string_length) {
      uVar19 = 0xf;
      if (local_248 != &local_238) {
        uVar19 = local_238;
      }
      if (uVar19 < local_240 + local_228._M_string_length) goto LAB_0015a665;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_248,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
    }
    else {
LAB_0015a665:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_248);
    }
    psVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268.field_2._8_8_ = puVar12[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_268._M_string_length = puVar12[1];
    *puVar12 = psVar16;
    puVar12[1] = 0;
    *(undefined1 *)psVar16 = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_268);
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar21) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_208,&local_128,&local_2b0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_248 = &local_238;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_238 = *puVar17;
      lStack_230 = plVar11[3];
    }
    else {
      local_238 = *puVar17;
      local_248 = (ulong *)*plVar11;
    }
    local_240 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1a8._M_dataplus._M_p);
    puVar17 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_228.field_2._M_allocated_capacity = *puVar17;
      local_228.field_2._8_8_ = puVar12[3];
      local_228._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar17;
      local_228._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_228._M_string_length = puVar12[1];
    *puVar12 = puVar17;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268.field_2._8_8_ = plVar11[3];
      local_268._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_268._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar21) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    pcVar15 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
    }
    else {
      sVar13 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
    }
    pSVar20 = *(SourceLocation **)&pOVar24[1].super_SourceLocation;
    if (pSVar20 != pOVar24[1].super_SourceLocation.parent_construct) {
      uVar23 = 0;
      do {
        local_228._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_1a8._M_dataplus._M_p,
                   local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
        std::__cxx11::string::append((char *)&local_228);
        uVar25 = 1;
        if (9 < uVar23) {
          uVar19 = (ulong)uVar23;
          uVar8 = 4;
          do {
            uVar25 = uVar8;
            uVar10 = (uint)uVar19;
            if (uVar10 < 100) {
              uVar25 = uVar25 - 2;
              goto LAB_0015c324;
            }
            if (uVar10 < 1000) {
              uVar25 = uVar25 - 1;
              goto LAB_0015c324;
            }
            if (uVar10 < 10000) goto LAB_0015c324;
            uVar19 = uVar19 / 10000;
            uVar8 = uVar25 + 4;
          } while (99999 < uVar10);
          uVar25 = uVar25 + 1;
        }
LAB_0015c324:
        local_248 = &local_238;
        std::__cxx11::string::_M_construct((ulong)&local_248,(char)uVar25);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_248,uVar25,uVar23);
        uVar22 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar21) {
          uVar22 = local_228.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar22 < local_240 + local_228._M_string_length) {
          uVar19 = 0xf;
          if (local_248 != &local_238) {
            uVar19 = local_238;
          }
          if (uVar19 < local_240 + local_228._M_string_length) goto LAB_0015c3b1;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_248,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
        }
        else {
LAB_0015c3b1:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_248);
        }
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        psVar16 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268.field_2._8_8_ = puVar12[3];
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_268._M_string_length = puVar12[1];
        *puVar12 = psVar16;
        puVar12[1] = 0;
        *(undefined1 *)psVar16 = 0;
        std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar21) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_148,&local_128,&local_128);
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_148,(ulong)local_1a8._M_dataplus._M_p);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_208.field_2._M_allocated_capacity = *psVar16;
          local_208.field_2._8_8_ = plVar11[3];
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar16;
          local_208._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_208._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_208);
        puVar17 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar17) {
          local_238 = *puVar17;
          lStack_230 = plVar11[3];
          local_248 = &local_238;
        }
        else {
          local_238 = *puVar17;
          local_248 = (ulong *)*plVar11;
        }
        local_240 = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_248,(ulong)local_288._M_dataplus._M_p);
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_228.field_2._M_allocated_capacity = *psVar16;
          local_228.field_2._8_8_ = plVar11[3];
          local_228._M_dataplus._M_p = (pointer)paVar21;
        }
        else {
          local_228.field_2._M_allocated_capacity = *psVar16;
          local_228._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_228._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268.field_2._8_8_ = plVar11[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_268._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar21) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        pcVar15 = local_168;
        if (local_168 == (char *)0x0) {
          std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
        }
        else {
          sVar13 = strlen(local_168);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
        }
        std::operator+(&local_50,&local_128,&local_128);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar18 = plVar11 + 2;
        if ((long *)*plVar11 == plVar18) {
          local_f0 = *plVar18;
          lStack_e8 = plVar11[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar18;
          local_100 = (long *)*plVar11;
        }
        local_f8 = plVar11[1];
        *plVar11 = (long)plVar18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_100,(ulong)local_288._M_dataplus._M_p);
        local_188 = &local_178;
        puVar17 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar17) {
          local_178 = *puVar17;
          lStack_170 = plVar11[3];
        }
        else {
          local_178 = *puVar17;
          local_188 = (ulong *)*plVar11;
        }
        local_180 = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148.field_2._8_8_ = plVar11[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_148._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_148,(ulong)local_288._M_dataplus._M_p);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_208.field_2._M_allocated_capacity = *psVar16;
          local_208.field_2._8_8_ = plVar11[3];
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar16;
          local_208._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_208._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_208);
        local_248 = &local_238;
        puVar17 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar17) {
          local_238 = *puVar17;
          lStack_230 = plVar11[3];
        }
        else {
          local_238 = *puVar17;
          local_248 = (ulong *)*plVar11;
        }
        local_240 = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,*(char **)pSVar20,&local_d9);
        uVar19 = 0xf;
        if (local_248 != &local_238) {
          uVar19 = local_238;
        }
        if (uVar19 < (ulong)(local_90 + local_240)) {
          uVar19 = 0xf;
          if (local_98 != local_88) {
            uVar19 = local_88[0];
          }
          if (uVar19 < (ulong)(local_90 + local_240)) goto LAB_0015c9ce;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_248);
        }
        else {
LAB_0015c9ce:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_98);
        }
        puVar17 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_228.field_2._M_allocated_capacity = *puVar17;
          local_228.field_2._8_8_ = puVar12[3];
          local_228._M_dataplus._M_p = (pointer)paVar21;
        }
        else {
          local_228.field_2._M_allocated_capacity = *puVar17;
          local_228._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_228._M_string_length = puVar12[1];
        *puVar12 = puVar17;
        puVar12[1] = 0;
        *(undefined1 *)puVar17 = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268.field_2._8_8_ = plVar11[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_268._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar21) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pcVar15 = local_168;
        if (local_168 == (char *)0x0) {
          std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
        }
        else {
          sVar13 = strlen(local_168);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
        }
        uVar23 = uVar23 + 1;
        pSVar20 = (SourceLocation *)&pSVar20->parent_construct;
      } while (pSVar20 != local_108[1].super_SourceLocation.parent_construct);
    }
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::__cxx11::string::append((char *)&local_268);
    pOVar24 = local_108;
    std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_268);
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_208,&local_128,&local_2b0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_248 = &local_238;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_238 = *puVar17;
      lStack_230 = plVar11[3];
    }
    else {
      local_238 = *puVar17;
      local_248 = (ulong *)*plVar11;
    }
    local_240 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_2d0);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_228.field_2._M_allocated_capacity = *psVar16;
      local_228.field_2._8_8_ = plVar11[3];
      local_228._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar16;
      local_228._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_228._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268.field_2._8_8_ = plVar11[3];
      local_268._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_268._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar21) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    pcVar15 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
    }
    else {
      sVar13 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
    }
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)&local_100);
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_2d0);
    local_188 = &local_178;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_178 = *puVar17;
      lStack_170 = plVar11[3];
    }
    else {
      local_178 = *puVar17;
      local_188 = (ulong *)*plVar11;
    }
    local_180 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148.field_2._8_8_ = plVar11[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_148._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_2d0);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_208.field_2._M_allocated_capacity = *psVar16;
      local_208.field_2._8_8_ = plVar11[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar16;
      local_208._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_208._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_248 = &local_238;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_238 = *puVar17;
      lStack_230 = plVar11[3];
    }
    else {
      local_238 = *puVar17;
      local_248 = (ulong *)*plVar11;
    }
    local_240 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_248,(ulong)local_1e8._M_dataplus._M_p);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_228.field_2._M_allocated_capacity = *psVar16;
      local_228.field_2._8_8_ = plVar11[3];
      local_228._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar16;
      local_228._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_228._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268.field_2._8_8_ = plVar11[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar16;
      local_268._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_268._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar21) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    pcVar15 = local_168;
    if (local_168 == (char *)0x0) {
      std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
    }
    else {
      sVar13 = strlen(local_168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,local_2c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 == &local_1b8) goto LAB_0015be5b;
  }
  else {
    if (OVar2 == OMPD_threadprivate) {
      local_1c0 = 0;
      local_1b8 = (ulong)local_1b8._1_7_ << 8;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1e8.field_2._M_allocated_capacity._1_7_ << 8;
      local_1e8._M_dataplus._M_p = (pointer)paVar27;
      local_1c8 = &local_1b8;
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"threadprivate","");
      paVar1 = &local_2b0.field_2;
      local_2b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      pOVar24 = local_108;
      std::__cxx11::string::append((char *)&local_2b0);
      local_2d0 = &local_2c0;
      std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x01');
      *(undefined1 *)local_2d0 = 0x30;
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        uVar22 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_2c8 + local_2b0._M_string_length) {
        uVar19 = 0xf;
        if (local_2d0 != &local_2c0) {
          uVar19 = local_2c0;
        }
        if (uVar19 < local_2c8 + local_2b0._M_string_length) goto LAB_00159ed9;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
      }
      else {
LAB_00159ed9:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0)
        ;
      }
      psVar16 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_288.field_2._M_allocated_capacity = *psVar16;
        local_288.field_2._8_8_ = puVar12[3];
        local_288._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar16;
        local_288._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_288._M_string_length = puVar12[1];
      *puVar12 = psVar16;
      puVar12[1] = 0;
      *(undefined1 *)psVar16 = 0;
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar21) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_268,&local_128,&local_1a8);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2d0 = &local_2c0;
      puVar17 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar17) {
        local_2c0 = *puVar17;
        lStack_2b8 = plVar11[3];
      }
      else {
        local_2c0 = *puVar17;
        local_2d0 = (ulong *)*plVar11;
      }
      local_2c8 = plVar11[1];
      *plVar11 = (long)puVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_1c8);
      puVar17 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_2b0.field_2._M_allocated_capacity = *puVar17;
        local_2b0.field_2._8_8_ = puVar12[3];
        local_2b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *puVar17;
        local_2b0._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_2b0._M_string_length = puVar12[1];
      *puVar12 = puVar17;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      puVar17 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_288.field_2._M_allocated_capacity = *puVar17;
        local_288.field_2._8_8_ = plVar11[3];
        local_288._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_288.field_2._M_allocated_capacity = *puVar17;
        local_288._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_288._M_string_length = plVar11[1];
      *plVar11 = (long)puVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar21) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      pcVar15 = local_168;
      if (local_168 == (char *)0x0) {
        std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
      }
      else {
        sVar13 = strlen(local_168);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
      }
      pSVar20 = *(SourceLocation **)&pOVar24[1].super_SourceLocation;
      if (pSVar20 != pOVar24[1].super_SourceLocation.parent_construct) {
        uVar23 = 0;
        do {
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,local_1c8,local_1c0 + (long)local_1c8);
          std::__cxx11::string::append((char *)&local_2b0);
          uVar25 = 1;
          if (9 < uVar23) {
            uVar19 = (ulong)uVar23;
            uVar8 = 4;
            do {
              uVar25 = uVar8;
              uVar10 = (uint)uVar19;
              if (uVar10 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_0015a9ad;
              }
              if (uVar10 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_0015a9ad;
              }
              if (uVar10 < 10000) goto LAB_0015a9ad;
              uVar19 = uVar19 / 10000;
              uVar8 = uVar25 + 4;
            } while (99999 < uVar10);
            uVar25 = uVar25 + 1;
          }
LAB_0015a9ad:
          local_2d0 = &local_2c0;
          std::__cxx11::string::_M_construct((ulong)&local_2d0,(char)uVar25);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2d0,uVar25,uVar23);
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            uVar22 = local_2b0.field_2._M_allocated_capacity;
          }
          paVar21 = &local_288.field_2;
          if ((ulong)uVar22 < local_2c8 + local_2b0._M_string_length) {
            uVar19 = 0xf;
            if (local_2d0 != &local_2c0) {
              uVar19 = local_2c0;
            }
            if (uVar19 < local_2c8 + local_2b0._M_string_length) goto LAB_0015aa23;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
          }
          else {
LAB_0015aa23:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0);
          }
          psVar16 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288.field_2._8_8_ = puVar12[3];
            local_288._M_dataplus._M_p = (pointer)paVar21;
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_288._M_string_length = puVar12[1];
          *puVar12 = psVar16;
          puVar12[1] = 0;
          *(undefined1 *)psVar16 = 0;
          std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != paVar21) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_228,&local_128,&local_128);
          plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1c8);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268.field_2._8_8_ = plVar11[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268._M_dataplus._M_p = (pointer)*plVar11;
          }
          paVar1 = &local_2b0.field_2;
          local_268._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_2d0 = &local_2c0;
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_2c0 = *puVar17;
            lStack_2b8 = plVar11[3];
          }
          else {
            local_2c0 = *puVar17;
            local_2d0 = (ulong *)*plVar11;
          }
          local_2c8 = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_2d0,(ulong)local_1e8._M_dataplus._M_p);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_2b0.field_2._M_allocated_capacity = *psVar16;
            local_2b0.field_2._8_8_ = plVar11[3];
            local_2b0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *psVar16;
            local_2b0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_2b0._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288.field_2._8_8_ = plVar11[3];
            local_288._M_dataplus._M_p = (pointer)paVar21;
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_288._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != paVar21) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          pcVar15 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
          }
          else {
            sVar13 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
          }
          std::operator+(&local_148,&local_128,&local_128);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_208.field_2._M_allocated_capacity = *psVar16;
            local_208.field_2._8_8_ = plVar11[3];
          }
          else {
            local_208.field_2._M_allocated_capacity = *psVar16;
            local_208._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_208._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_208,(ulong)local_1e8._M_dataplus._M_p);
          local_248 = &local_238;
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_238 = *puVar17;
            lStack_230 = plVar11[3];
          }
          else {
            local_238 = *puVar17;
            local_248 = (ulong *)*plVar11;
          }
          local_240 = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_228.field_2._M_allocated_capacity = *psVar16;
            local_228.field_2._8_8_ = plVar11[3];
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar16;
            local_228._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_228._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_228,(ulong)local_1e8._M_dataplus._M_p);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268.field_2._8_8_ = plVar11[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_268._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_2d0 = &local_2c0;
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_2c0 = *puVar17;
            lStack_2b8 = plVar11[3];
          }
          else {
            local_2c0 = *puVar17;
            local_2d0 = (ulong *)*plVar11;
          }
          local_2c8 = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,*(char **)pSVar20,(allocator<char> *)&local_100);
          uVar19 = 0xf;
          if (local_2d0 != &local_2c0) {
            uVar19 = local_2c0;
          }
          if (uVar19 < (ulong)(local_180 + local_2c8)) {
            uVar19 = 0xf;
            if (local_188 != &local_178) {
              uVar19 = local_178;
            }
            if (uVar19 < (ulong)(local_180 + local_2c8)) goto LAB_0015afe0;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,(ulong)local_2d0);
          }
          else {
LAB_0015afe0:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_188);
          }
          puVar17 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_2b0.field_2._M_allocated_capacity = *puVar17;
            local_2b0.field_2._8_8_ = puVar12[3];
            local_2b0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *puVar17;
            local_2b0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_2b0._M_string_length = puVar12[1];
          *puVar12 = puVar17;
          puVar12[1] = 0;
          *(undefined1 *)puVar17 = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          puVar17 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_288.field_2._M_allocated_capacity = *puVar17;
            local_288.field_2._8_8_ = plVar11[3];
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          }
          else {
            local_288.field_2._M_allocated_capacity = *puVar17;
            local_288._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_288._M_string_length = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if (local_248 != &local_238) {
            operator_delete(local_248,local_238 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          pcVar15 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
          }
          else {
            sVar13 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
          }
          uVar23 = uVar23 + 1;
          pSVar20 = (SourceLocation *)&pSVar20->parent_construct;
        } while (pSVar20 != local_108[1].super_SourceLocation.parent_construct);
      }
    }
    else {
      if (OVar2 != OMPD_allocate) goto LAB_0015be5b;
      local_1c0 = 0;
      local_1b8 = (ulong)local_1b8._1_7_ << 8;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1e8.field_2._M_allocated_capacity._1_7_ << 8;
      local_1e8._M_dataplus._M_p = (pointer)paVar27;
      local_1c8 = &local_1b8;
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"allocate","");
      paVar1 = &local_2b0.field_2;
      local_2b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      std::__cxx11::string::append((char *)&local_2b0);
      local_2d0 = &local_2c0;
      std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x01');
      *(undefined1 *)local_2d0 = 0x30;
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        uVar22 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_2c8 + local_2b0._M_string_length) {
        uVar19 = 0xf;
        if (local_2d0 != &local_2c0) {
          uVar19 = local_2c0;
        }
        if (uVar19 < local_2c8 + local_2b0._M_string_length) goto LAB_00159dcd;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
      }
      else {
LAB_00159dcd:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0)
        ;
      }
      psVar16 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_288.field_2._M_allocated_capacity = *psVar16;
        local_288.field_2._8_8_ = puVar12[3];
        local_288._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar16;
        local_288._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_288._M_string_length = puVar12[1];
      *puVar12 = psVar16;
      puVar12[1] = 0;
      *(undefined1 *)psVar16 = 0;
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar21) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_268,&local_128,&local_1a8);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2d0 = &local_2c0;
      puVar17 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar17) {
        local_2c0 = *puVar17;
        lStack_2b8 = plVar11[3];
      }
      else {
        local_2c0 = *puVar17;
        local_2d0 = (ulong *)*plVar11;
      }
      local_2c8 = plVar11[1];
      *plVar11 = (long)puVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_1c8);
      puVar17 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_2b0.field_2._M_allocated_capacity = *puVar17;
        local_2b0.field_2._8_8_ = puVar12[3];
        local_2b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *puVar17;
        local_2b0._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_2b0._M_string_length = puVar12[1];
      *puVar12 = puVar17;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      puVar17 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_288.field_2._M_allocated_capacity = *puVar17;
        local_288.field_2._8_8_ = plVar11[3];
        local_288._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_288.field_2._M_allocated_capacity = *puVar17;
        local_288._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_288._M_string_length = plVar11[1];
      *plVar11 = (long)puVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar21) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      pcVar15 = local_168;
      if (local_168 == (char *)0x0) {
        std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
      }
      else {
        sVar13 = strlen(local_168);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
      }
      pSVar20 = *(SourceLocation **)&pOVar24[1].super_SourceLocation;
      if (pSVar20 != pOVar24[1].super_SourceLocation.parent_construct) {
        uVar23 = 0;
        do {
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,local_1c8,local_1c0 + (long)local_1c8);
          std::__cxx11::string::append((char *)&local_2b0);
          uVar25 = 1;
          if (9 < uVar23) {
            uVar19 = (ulong)uVar23;
            uVar8 = 4;
            do {
              uVar25 = uVar8;
              uVar10 = (uint)uVar19;
              if (uVar10 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_0015b562;
              }
              if (uVar10 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_0015b562;
              }
              if (uVar10 < 10000) goto LAB_0015b562;
              uVar19 = uVar19 / 10000;
              uVar8 = uVar25 + 4;
            } while (99999 < uVar10);
            uVar25 = uVar25 + 1;
          }
LAB_0015b562:
          local_2d0 = &local_2c0;
          std::__cxx11::string::_M_construct((ulong)&local_2d0,(char)uVar25);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2d0,uVar25,uVar23);
          uVar22 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            uVar22 = local_2b0.field_2._M_allocated_capacity;
          }
          paVar21 = &local_288.field_2;
          if ((ulong)uVar22 < local_2c8 + local_2b0._M_string_length) {
            uVar19 = 0xf;
            if (local_2d0 != &local_2c0) {
              uVar19 = local_2c0;
            }
            if (uVar19 < local_2c8 + local_2b0._M_string_length) goto LAB_0015b5d8;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
          }
          else {
LAB_0015b5d8:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0);
          }
          psVar16 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288.field_2._8_8_ = puVar12[3];
            local_288._M_dataplus._M_p = (pointer)paVar21;
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_288._M_string_length = puVar12[1];
          *puVar12 = psVar16;
          puVar12[1] = 0;
          *(undefined1 *)psVar16 = 0;
          std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != paVar21) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_228,&local_128,&local_128);
          plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1c8);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268.field_2._8_8_ = plVar11[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268._M_dataplus._M_p = (pointer)*plVar11;
          }
          paVar1 = &local_2b0.field_2;
          local_268._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_2d0 = &local_2c0;
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_2c0 = *puVar17;
            lStack_2b8 = plVar11[3];
          }
          else {
            local_2c0 = *puVar17;
            local_2d0 = (ulong *)*plVar11;
          }
          local_2c8 = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_2d0,(ulong)local_1e8._M_dataplus._M_p);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_2b0.field_2._M_allocated_capacity = *psVar16;
            local_2b0.field_2._8_8_ = plVar11[3];
            local_2b0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *psVar16;
            local_2b0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_2b0._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288.field_2._8_8_ = plVar11[3];
            local_288._M_dataplus._M_p = (pointer)paVar21;
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar16;
            local_288._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_288._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != paVar21) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          pcVar15 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
          }
          else {
            sVar13 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
          }
          std::operator+(&local_148,&local_128,&local_128);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_208.field_2._M_allocated_capacity = *psVar16;
            local_208.field_2._8_8_ = plVar11[3];
          }
          else {
            local_208.field_2._M_allocated_capacity = *psVar16;
            local_208._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_208._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_208,(ulong)local_1e8._M_dataplus._M_p);
          local_248 = &local_238;
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_238 = *puVar17;
            lStack_230 = plVar11[3];
          }
          else {
            local_238 = *puVar17;
            local_248 = (ulong *)*plVar11;
          }
          local_240 = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_228.field_2._M_allocated_capacity = *psVar16;
            local_228.field_2._8_8_ = plVar11[3];
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar16;
            local_228._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_228._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_228,(ulong)local_1e8._M_dataplus._M_p);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268.field_2._8_8_ = plVar11[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar16;
            local_268._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_268._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_2d0 = &local_2c0;
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_2c0 = *puVar17;
            lStack_2b8 = plVar11[3];
          }
          else {
            local_2c0 = *puVar17;
            local_2d0 = (ulong *)*plVar11;
          }
          local_2c8 = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,*(char **)pSVar20,(allocator<char> *)&local_100);
          uVar19 = 0xf;
          if (local_2d0 != &local_2c0) {
            uVar19 = local_2c0;
          }
          if (uVar19 < (ulong)(local_180 + local_2c8)) {
            uVar19 = 0xf;
            if (local_188 != &local_178) {
              uVar19 = local_178;
            }
            if (uVar19 < (ulong)(local_180 + local_2c8)) goto LAB_0015bb95;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,(ulong)local_2d0);
          }
          else {
LAB_0015bb95:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_188);
          }
          puVar17 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_2b0.field_2._M_allocated_capacity = *puVar17;
            local_2b0.field_2._8_8_ = puVar12[3];
            local_2b0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *puVar17;
            local_2b0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_2b0._M_string_length = puVar12[1];
          *puVar12 = puVar17;
          puVar12[1] = 0;
          *(undefined1 *)puVar17 = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          puVar17 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_288.field_2._M_allocated_capacity = *puVar17;
            local_288.field_2._8_8_ = plVar11[3];
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          }
          else {
            local_288.field_2._M_allocated_capacity = *puVar17;
            local_288._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_288._M_string_length = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if (local_248 != &local_238) {
            operator_delete(local_248,local_238 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          pcVar15 = local_168;
          if (local_168 == (char *)0x0) {
            std::ios::clear((int)local_290 + (int)*(undefined8 *)(*(long *)local_290 + -0x18));
          }
          else {
            sVar13 = strlen(local_168);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar15,sVar13);
          }
          uVar23 = uVar23 + 1;
          pSVar20 = (SourceLocation *)&pSVar20->parent_construct;
        } while (pSVar20 != local_108[1].super_SourceLocation.parent_construct);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    pOVar24 = local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 == &local_1b8) goto LAB_0015be5b;
  }
  operator_delete(local_1c8,local_1b8 + 1);
LAB_0015be5b:
  pvVar5 = pOVar24->clauses_in_original_order;
  ppOVar26 = (pvVar5->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (((pvVar5->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
       super__Vector_impl_data._M_finish != ppOVar26) &&
     (ppOVar26 !=
      (pvVar5->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_e0 = local_e0 + 1;
    uVar19 = 0;
    do {
      pOVar6 = *ppOVar26;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      (*pOVar6->_vptr_OpenMPClause[1])(pOVar6,local_290,(ulong)local_e0,uVar19,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      ppOVar26 = ppOVar26 + 1;
    } while (ppOVar26 !=
             (pvVar5->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void OpenMPDirective::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node, std::string trait_score) {

    std::string directive_kind;
    OpenMPDirectiveKind kind = this->getKind();
    switch(kind) {
        case OMPD_cancellation_point :
            directive_kind = "cancellation_point";
            break;
        case OMPD_for_simd:
            directive_kind = "for_simd";
            break;
        case OMPD_distribute_simd:
            directive_kind = "distribute_simd";
            break;
        case OMPD_distribute_parallel_for:
            directive_kind = "distribute_parallel_for";
            break; 
       case OMPD_distribute_parallel_do:
            directive_kind = "distribute_parallel_do";
            break;
        case OMPD_distribute_parallel_for_simd:
            directive_kind = "distribute_parallel_for_simd";
            break;
        case OMPD_distribute_parallel_do_simd:
            directive_kind = "distribute_parallel_do_simd";
            break;
        case OMPD_declare_reduction:
            directive_kind = "declare_reduction";
            break;
        case OMPD_declare_mapper:
            directive_kind = "declare_mapper";
            break;
        case OMPD_taskloop_simd:
            directive_kind = "taskloop_simd";
            break;
        case OMPD_target_data:
            directive_kind = "target_data";
            break;
        case OMPD_target_enter_data:
            directive_kind = "target_enter_data";
            break;
        case OMPD_target_exit_data:
            directive_kind = "target_exit_data";
            break;
        case OMPD_target_update:
            directive_kind = "target_update";
            break;
        case OMPD_declare_target:
            directive_kind = "declare_target";
            break;
        case OMPD_end_declare_target:
            directive_kind = "end_declare_target";
            break;
        case OMPD_depobj:
            directive_kind = "depobj ";
            break;
        case OMPD_teams_distribute:
            directive_kind += "teams_distribute ";
            break;
        case OMPD_teams_distribute_simd:
            directive_kind += "teams_distribute_simd ";
            break;
        case OMPD_teams_distribute_parallel_for:
            directive_kind += "teams_distribute_parallel_for ";
            break;
        case OMPD_teams_distribute_parallel_for_simd:
            directive_kind += "teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_loop:
            directive_kind += "teams_loop ";
            break;
        case OMPD_target_parallel:
            directive_kind += "target_parallel ";
            break;
        case OMPD_target_parallel_for:
            directive_kind += "target_parallel_for ";
            break;
        case OMPD_target_parallel_for_simd:
            directive_kind += "target_parallel_for_simd ";
            break;
        case OMPD_target_parallel_loop:
            directive_kind += "target_parallel_loop ";
            break;
        case OMPD_target_simd:
            directive_kind += "target_simd ";
            break;
        case OMPD_target_teams:
            directive_kind += "target_teams ";
            break;
        case OMPD_target_teams_distribute:
            directive_kind += "target_teams_distribute ";
            break;
        case OMPD_target_teams_distribute_simd:
            directive_kind += "target_teams_distribute_simd ";
            break;
        case OMPD_target_teams_loop:
            directive_kind += "target_teams_loop ";
            break;
        case OMPD_target_teams_distribute_parallel_for:
            directive_kind += "target_teams_distribute_parallel_for ";
            break;
        case OMPD_target_teams_distribute_parallel_for_simd:
            directive_kind += "target_teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_distribute_parallel_do:
            directive_kind += "teams distribute parallel do ";
            break;
        case OMPD_teams_distribute_parallel_do_simd:
            directive_kind += "teams distribute parallel do simd ";
            break;
        case OMPD_target_parallel_do:
            directive_kind += "target parallel do ";
            break;
        case OMPD_target_parallel_do_simd:
            directive_kind += "target parallel do simd ";
            break;
        case OMPD_target_teams_distribute_parallel_do:
            directive_kind += "target teams distribute parallel do ";
            break;
        case OMPD_target_teams_distribute_parallel_do_simd:
            directive_kind += "target teams distribute parallel do simd ";
            break;
        default:
            directive_kind = this->toString().substr(0, this->toString().size()-1);
    }
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string directive_id = parent_node + "_" + directive_kind + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + directive_id + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    dot_file << indent << directive_id.c_str() << " [label = \"" + directive_kind + "\"]\n";

    // output score
    if (trait_score != "") {
        current_line = indent + directive_id + " -- " + directive_id + "_score" + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + directive_id + "_score" + " [label = \"score\\n " + trait_score + "\"]\n";
        dot_file << current_line.c_str();
    }; 

    switch (kind) {
        case OMPD_allocate: {
            std::vector<const char *> *list = ((OpenMPAllocateDirective *) this)->getAllocateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "allocate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_threadprivate: {
            std::vector<const char *> *list = ((OpenMPThreadprivateDirective*)this)->getThreadprivateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "threadprivate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_declare_reduction: {
            std::vector<const char*>* list = ((OpenMPDeclareReductionDirective*)this)->getTypenameList();
            std::vector<const char*>::iterator list_item;
            std::string id = ((OpenMPDeclareReductionDirective*)this)->getIdentifier();
            std::string combiner = ((OpenMPDeclareReductionDirective*)this)->getCombiner();
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "declare_reduction";
            std::string node_id = tkind + "_reduction_identifier";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + id + "\"]\n";
            dot_file << current_line.c_str();
            list_name = tkind + "_typename_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            node_id = tkind + "_combiner";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + combiner + "\"]\n";
            dot_file << current_line.c_str();
            break;
        }
        default: {
            ;
        }
    };

    std::vector<OpenMPClause*>* clauses = this->getClausesInOriginalOrder();
    if (clauses->size() != 0) {
        std::vector<OpenMPClause*>::iterator iter;
        int clause_index = 0;
        for (iter = clauses->begin(); iter != clauses->end(); iter++) {
            (*iter)->generateDOT(dot_file, depth+1, clause_index, directive_id);
            clause_index += 1;
        };
    };

}